

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::RealisticCamera,pbrt::CameraBaseParameters&,std::vector<float,std::allocator<float>>&,float&,float&,pbrt::Image,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,RealisticCamera *p,CameraBaseParameters *args,
          vector<float,_std::allocator<float>_> *args_1,float *args_2,float *args_3,Image *args_4,
          polymorphic_allocator<std::byte> *args_5)

{
  CameraBaseParameters *in_RCX;
  RealisticCamera *in_RDX;
  Allocator in_RSI;
  vector<float,_std::allocator<float>_> *in_R8;
  undefined8 in_R9;
  CameraBaseParameters *this_00;
  Image *in_stack_fffffffffffffb58;
  Image *in_stack_fffffffffffffb60;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  in_stack_ffffffffffffffc8;
  
  this_00 = (CameraBaseParameters *)&stack0xfffffffffffffc80;
  pbrt::CameraBaseParameters::CameraBaseParameters
            (this_00,(CameraBaseParameters *)in_RSI.memoryResource);
  pbrt::Image::Image(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  pbrt::RealisticCamera::RealisticCamera
            (in_RDX,in_RCX,in_R8,(Float)((ulong)in_R9 >> 0x20),(Float)in_R9,
             (Image *)in_stack_ffffffffffffffc8.bits,in_RSI);
  pbrt::Image::~Image((Image *)this_00);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }